

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O3

bool __thiscall
sptk::ScalarOperation::Run(ScalarOperation *this,double *number,bool *is_magic_number)

{
  pointer ppMVar1;
  char cVar2;
  pointer ppMVar4;
  int iVar3;
  
  if (is_magic_number == (bool *)0x0 || number == (double *)0x0) {
    return false;
  }
  *is_magic_number = false;
  ppMVar1 = (this->modules_).
            super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 ==
      (this->modules_).
      super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cVar2 = '\x01';
  }
  else {
    do {
      ppMVar4 = ppMVar1 + 1;
      iVar3 = (*(*ppMVar1)->_vptr_ModuleInterface[2])(*ppMVar1,number,is_magic_number);
      cVar2 = (char)iVar3;
      if (cVar2 == '\0') {
        return false;
      }
      ppMVar1 = ppMVar4;
    } while (ppMVar4 !=
             (this->modules_).
             super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return (bool)cVar2;
}

Assistant:

bool ScalarOperation::Run(double* number, bool* is_magic_number) const {
  if (NULL == number || NULL == is_magic_number) {
    return false;
  }

  *is_magic_number = false;
  for (std::vector<ScalarOperation::ModuleInterface*>::const_iterator itr(
           modules_.begin());
       itr != modules_.end(); ++itr) {
    if (!(*itr)->Run(number, is_magic_number)) {
      return false;
    }
  }

  return true;
}